

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseUnsignedProperty
               (size_t *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  reference pbVar2;
  unsigned_long uVar3;
  json_const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  json_const_iterator local_48;
  
  local_48.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_48.m_object = (pointer)0x0;
  local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar1 = detail::FindMember(o,(property->_M_dataplus)._M_p,&local_48);
  if (bVar1) {
    pbVar2 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_48);
    if (pbVar2->m_type == number_unsigned) {
      uVar3 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<unsigned_long,_0>(pbVar2);
      if (ret == (size_t *)0x0) {
        return true;
      }
      *ret = uVar3;
      return true;
    }
    if (required && err != (string *)0x0) {
      std::operator+(&local_68,"\'",property);
      std::operator+(&bStack_88,&local_68,"\' property is not a positive integer.\n");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&bStack_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else if (required && err != (string *)0x0) {
    std::operator+(&local_68,"\'",property);
    std::operator+(&bStack_88,&local_68,"\' property is missing");
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    if (parent_node->_M_string_length != 0) {
      std::operator+(&bStack_88," in ",parent_node);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&bStack_88);
    }
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

static bool ParseUnsignedProperty(size_t *ret, std::string *err,
                                  const detail::json &o,
                                  const std::string &property,
                                  const bool required,
                                  const std::string &parent_node = "") {
  detail::json_const_iterator it;
  if (!detail::FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  auto &value = detail::GetValue(it);

  size_t uValue = 0;
  bool isUValue;
#ifdef TINYGLTF_USE_RAPIDJSON
  isUValue = false;
  if (value.IsUint()) {
    uValue = value.GetUint();
    isUValue = true;
  } else if (value.IsUint64()) {
    uValue = value.GetUint64();
    isUValue = true;
  }
#else
  isUValue = value.is_number_unsigned();
  if (isUValue) {
    uValue = value.get<size_t>();
  }
#endif
  if (!isUValue) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a positive integer.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = uValue;
  }

  return true;
}